

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

bool __thiscall
vera::Scene::addTexture(Scene *this,string *_name,Image *_image,bool _flip,bool _verbose)

{
  TexturesMap *this_00;
  int iVar1;
  iterator iVar2;
  mapped_type *ppTVar3;
  Texture *pTVar4;
  ostream *poVar5;
  bool bVar6;
  
  this_00 = &this->textures;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
          ::find(&this_00->_M_t,_name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->textures)._M_t._M_impl.super__Rb_tree_header) {
    pTVar4 = (Texture *)operator_new(0x48);
    Texture::Texture(pTVar4);
    iVar1 = (*pTVar4->_vptr_Texture[2])(pTVar4,_image,0,0);
    if ((char)iVar1 == '\0') {
      (*pTVar4->_vptr_Texture[1])(pTVar4);
      bVar6 = false;
    }
    else {
      ppTVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                ::operator[](this_00,_name);
      *ppTVar3 = pTVar4;
      bVar6 = true;
      if (_verbose) {
        poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D   ");
        poVar5 = std::operator<<(poVar5,(string *)_name);
        poVar5 = std::operator<<(poVar5,";");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,"uniform vec2        ");
        poVar5 = std::operator<<(poVar5,(string *)_name);
        poVar5 = std::operator<<(poVar5,"Resolution;");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
  }
  else {
    ppTVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
              ::operator[](this_00,_name);
    bVar6 = false;
    (*(*ppTVar3)->_vptr_Texture[2])(*ppTVar3,_image,0,0);
    pTVar4 = (Texture *)operator_new(0x48);
    Texture::Texture(pTVar4);
  }
  return bVar6;
}

Assistant:

bool Scene::addTexture(const std::string& _name, const Image& _image, bool _flip, bool _verbose) {
    if (textures.find(_name) == textures.end()) {
        Texture* tex = new Texture();

        // TODO:
        //  - flip

        // load an image into the texture
        if (tex->load(_image)) {
            
            // the image is loaded finish add the texture to the uniform list
            textures[_name] = tex;
            
            if (_verbose) {
                std::cout << "uniform sampler2D   " << _name  << ";"<< std::endl;
                std::cout << "uniform vec2        " << _name  << "Resolution;"<< std::endl;
            }

            return true;
        }
        else
            delete tex;
    }
    else {
        // TODO:
        //  - flip
        //  - error handling

        textures[_name]->load(_image);
        Texture* tex = new Texture();
    }
    return false;
}